

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigIntInherited.cpp
# Opt level: O0

ostream * operator<<(ostream *os,BigIntInherited *obj)

{
  BigIntInherited *os_00;
  ostream *poVar1;
  BigInt local_38;
  BigIntInherited *local_18;
  BigIntInherited *obj_local;
  ostream *os_local;
  
  local_18 = obj;
  obj_local = (BigIntInherited *)os;
  poVar1 = std::operator<<(os,"\x1b[0;");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->_color);
  std::operator<<(poVar1,"m");
  os_00 = obj_local;
  BigInt::BigInt(&local_38,&local_18->super_BigInt);
  operator<<((ostream *)os_00,&local_38);
  BigInt::~BigInt(&local_38);
  poVar1 = std::operator<<((ostream *)obj_local,"\x1b[0;");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1e);
  std::operator<<(poVar1,"m");
  return (ostream *)obj_local;
}

Assistant:

ostream &operator<<(ostream &os, const BigIntInherited &obj)
{
    os << "\033[0;" << obj._color << "m";
    os << (BigInt) obj;
    os << "\033[0;" << 30 << "m";
    return os;
}